

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O2

void __thiscall
r_exec::CSTOverlay::update(CSTOverlay *this,HLPBindingMap *map,_Fact *input,_Fact *bound_pattern)

{
  atomic_int_fast64_t *paVar1;
  pointer pPVar2;
  bool bVar3;
  Pred *this_00;
  _Fact *this_01;
  pointer pPVar4;
  P<r_exec::Sim> simulation;
  P<r_exec::_Fact> local_38;
  float local_2c;
  
  core::P<r_exec::HLPBindingMap>::operator=(&(this->super_HLPOverlay).bindings,map);
  if (input != (_Fact *)0x0) {
    LOCK();
    paVar1 = &(input->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  local_38.object = (_Object *)input;
  std::vector<core::P<r_exec::_Fact>,std::allocator<core::P<r_exec::_Fact>>>::
  emplace_back<core::P<r_exec::_Fact>>
            ((vector<core::P<r_exec::_Fact>,std::allocator<core::P<r_exec::_Fact>>> *)&this->inputs,
             &local_38);
  core::P<r_exec::_Fact>::~P(&local_38);
  this_00 = _Fact::get_pred(input);
  if (this_00 == (Pred *)0x0) {
    local_2c = _Fact::get_cfd(input);
  }
  else {
    this_01 = Pred::get_target(this_00);
    local_2c = _Fact::get_cfd(this_01);
    bVar3 = Pred::is_simulation(this_00);
    if (bVar3) {
      pPVar2 = (this_00->simulations).
               super__Vector_base<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pPVar4 = (this_00->simulations).
                    super__Vector_base<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pPVar4 != pPVar2; pPVar4 = pPVar4 + 1
          ) {
        local_38.object = pPVar4->object;
        if (local_38.object != (_Object *)0x0) {
          LOCK();
          ((local_38.object)->refCount).super___atomic_base<long>._M_i =
               ((local_38.object)->refCount).super___atomic_base<long>._M_i + 1;
          UNLOCK();
        }
        std::__detail::
        _Insert_base<core::P<r_exec::Sim>,_core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>,_std::__detail::_Identity,_std::equal_to<core::P<r_exec::Sim>_>,_r_code::PHash<r_exec::Sim>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<core::P<r_exec::Sim>,_core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>,_std::__detail::_Identity,_std::equal_to<core::P<r_exec::Sim>_>,_r_code::PHash<r_exec::Sim>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&this->simulations,(value_type *)&local_38);
        core::P<r_exec::Sim>::~P((P<r_exec::Sim> *)&local_38);
      }
    }
    else {
      LOCK();
      paVar1 = &(input->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                super_Code.super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      local_38.object = (_Object *)input;
      std::__detail::
      _Insert<core::P<r_exec::_Fact>,_core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>,_std::__detail::_Identity,_std::equal_to<core::P<r_exec::_Fact>_>,_r_code::PHash<r_exec::_Fact>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert((_Insert<core::P<r_exec::_Fact>,_core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>,_std::__detail::_Identity,_std::equal_to<core::P<r_exec::_Fact>_>,_r_code::PHash<r_exec::_Fact>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                *)&this->predictions,&local_38);
      core::P<r_exec::_Fact>::~P(&local_38);
    }
  }
  if ((double)local_2c < this->lowest_cfd) {
    this->lowest_cfd = (double)local_2c;
  }
  return;
}

Assistant:

void CSTOverlay::update(HLPBindingMap *map, _Fact *input, _Fact *bound_pattern)
{
    bindings = map;
    inputs.push_back(input);
    double last_cfd;
    Pred *prediction = input->get_pred();

    if (prediction) {
        last_cfd = prediction->get_target()->get_cfd();

        if (prediction->is_simulation()) {
            for (P<Sim> simulation : prediction->simulations) {
                simulations.insert(simulation);
            }
        } else {
            predictions.insert(input);
        }
    } else {
        last_cfd = input->get_cfd();
    }

    if (lowest_cfd > last_cfd) {
        lowest_cfd = last_cfd;
    }
}